

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O0

wchar_t borg_attack_aux_artifact_holcolleth(void)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t d;
  wchar_t p2;
  wchar_t p1;
  
  _Var1 = borg_equips_item(act_sleepii,true);
  if (_Var1) {
    borg_sleep_spell_ii = false;
    wVar2 = borg_danger(borg.c.y,borg.c.x,L'\x04',true,false);
    borg_sleep_spell_ii = true;
    wVar3 = borg_danger(borg.c.y,borg.c.x,L'\x04',true,false);
    borg_sleep_spell_ii = false;
    p2 = wVar2 - wVar3;
    if (((borg_simulate & 1U) == 0) && (_Var1 = borg_activate_item(act_sleepii), !_Var1)) {
      borg_note("# Failed to properly activate the artifact");
      p2 = L'\0';
    }
  }
  else {
    p2 = L'\0';
  }
  return p2;
}

Assistant:

static int borg_attack_aux_artifact_holcolleth(void)
{
    int p1 = 0;
    int p2 = 0;
    int d  = 0;

    if (!borg_equips_item(act_sleepii, true))
        return 0;

    /* Obtain initial danger */
    borg_sleep_spell_ii = false;
    p1                  = borg_danger(borg.c.y, borg.c.x, 4, true, false);

    /* What effect is there? */
    borg_sleep_spell_ii = true;
    p2                  = borg_danger(borg.c.y, borg.c.x, 4, true, false);
    borg_sleep_spell_ii = false;

    /* value is d, enhance the value for rogues and rangers so that
     * they can use their critical hits.
     */
    d = (p1 - p2);

    /* Simulation */
    if (borg_simulate)
        return d;

    /* Cast the spell */
    if (borg_activate_item(act_sleepii)) {
        /* Value */
        return d;
    } else {
        borg_note("# Failed to properly activate the artifact");
        return 0;
    }
}